

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCircle::IfcCircle(IfcCircle *this)

{
  IfcCircle *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x68,"IfcCircle");
  IfcConic::IfcConic(&this->super_IfcConic,&PTR_construction_vtable_24__00f99570);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircle,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircle,_1UL> *)
             &(this->super_IfcConic).field_0x50,&PTR_construction_vtable_24__00f99620);
  (this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf99490;
  *(undefined8 *)&this->field_0x68 = 0xf99558;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf994b8;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf994e0;
  *(undefined8 *)
   &(this->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 = 0xf99508
  ;
  *(undefined8 *)&(this->super_IfcConic).field_0x50 = 0xf99530;
  return;
}

Assistant:

IfcCircle() : Object("IfcCircle") {}